

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O0

void __thiscall MainWindow::onFileOpen(MainWindow *this)

{
  bool bVar1;
  QFlags<QFileDialog::Option> local_84;
  QString local_80;
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString path;
  MainWindow *this_local;
  
  path.d.size = (qsizetype)this;
  bVar1 = maybeSave(this);
  if (bVar1) {
    tr(&local_40,"Open module",(char *)0x0,-1);
    QString::QString(&local_58,"");
    tr(&local_80,MainWindowTU::MODULE_FILE_FILTER,(char *)0x0,-1);
    QFlags<QFileDialog::Option>::QFlags(&local_84);
    QFileDialog::getOpenFileName
              ((QWidget *)local_28,(QString *)this,(QString *)&local_40,(QString *)&local_58,
               (QString *)&local_80,(QFlags_conflict1 *)0x0);
    QString::~QString(&local_80);
    QString::~QString(&local_58);
    QString::~QString(&local_40);
    bVar1 = QString::isEmpty((QString *)local_28);
    if (!bVar1) {
      openFile(this,(QString *)local_28);
    }
    QString::~QString((QString *)local_28);
  }
  return;
}

Assistant:

void MainWindow::onFileOpen() {
    if (!maybeSave()) {
        return;
    }
    
    auto path = QFileDialog::getOpenFileName(
        this,
        tr("Open module"),
        "",
        tr(TU::MODULE_FILE_FILTER)
    );

    if (path.isEmpty()) {
        return;
    }

    openFile(path);

}